

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo_server_sync.cpp
# Opt level: O1

void Session(socket *socket)

{
  bool bVar1;
  size_t sVar2;
  runtime_error *this;
  error_code ec;
  array<char,_1024UL> data;
  error_code local_4a0;
  error_code local_490;
  undefined1 *local_480;
  size_t local_478;
  undefined1 local_470 [24];
  error_category *local_458;
  _Alloc_hider local_450;
  size_type local_448;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_440;
  undefined1 local_430 [1024];
  
  do {
    boost::system::error_code::error_code(&local_4a0);
    sVar2 = boost::asio::detail::socket_ops::sync_recv1
                      ((socket->
                       super_basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                       ).impl_.implementation_.super_base_implementation_type.socket_,
                       (socket->
                       super_basic_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
                       ).impl_.implementation_.super_base_implementation_type.state_,local_430,0x400
                       ,0,&local_4a0);
    boost::system::error_code::error_code<boost::asio::error::misc_errors>
              ((error_code *)local_470,eof,(type *)0x0);
    if (local_4a0.val_ == local_470._0_4_) {
      bVar1 = (local_4a0.cat_)->id_ == *(ulong_long_type *)(local_470._8_8_ + 8);
      if (*(ulong_long_type *)(local_470._8_8_ + 8) == 0) {
        bVar1 = local_4a0.cat_ == (error_category *)local_470._8_8_;
      }
      if (bVar1) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Connection closed cleanly by peer.",0x22);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
        std::ostream::put(-0x40);
        std::ostream::flush();
        return;
      }
    }
    if (local_4a0.failed_ == true) {
      this = (runtime_error *)__cxa_allocate_exception(0x40);
      std::runtime_error::runtime_error(this,"");
      *(undefined ***)this = &PTR__system_error_00124220;
      *(ulong *)(this + 0x10) = CONCAT44(local_4a0._4_4_,local_4a0.val_);
      *(error_category **)(this + 0x18) = local_4a0.cat_;
      *(runtime_error **)(this + 0x20) = this + 0x30;
      *(undefined8 *)(this + 0x28) = 0;
      this[0x30] = (runtime_error)0x0;
      __cxa_throw(this,&boost::system::system_error::typeinfo,
                  boost::system::system_error::~system_error);
    }
    if (0x3ff < sVar2) {
      sVar2 = 0x400;
    }
    local_480 = local_430;
    local_478 = sVar2;
    boost::system::error_code::error_code(&local_490);
    local_470._0_8_ = &local_480;
    boost::asio::detail::
    write_buffer_sequence<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>,boost::asio::mutable_buffer,boost::asio::mutable_buffer_const*,boost::asio::detail::transfer_all_t>
              (socket,&local_480,(error_code *)local_470,&local_490);
  } while (local_490.failed_ != true);
  std::runtime_error::runtime_error((runtime_error *)local_470,"write");
  local_450._M_p = (pointer)&local_440;
  local_470._0_8_ = &PTR__system_error_00124220;
  local_458 = local_490.cat_;
  local_448 = 0;
  local_440._M_local_buf[0] = '\0';
  boost::throw_exception<boost::system::system_error>((system_error *)local_470);
}

Assistant:

void Session(tcp::socket socket) {
  try {
    while (true) {
      std::array<char, BUF_SIZE> data;

      boost::system::error_code ec;
      std::size_t length = socket.read_some(boost::asio::buffer(data), ec);

      if (ec == boost::asio::error::eof) {
        std::cout << "Connection closed cleanly by peer." << std::endl;
        break;
      } else if (ec) {
        // Some other error
        throw boost::system::system_error(ec);
      }

      boost::asio::write(socket, boost::asio::buffer(data, length));
    }
  } catch (const std::exception& e) {
    std::cerr << "Exception: " <<  e.what() << std::endl;
  }
}